

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ref_geom.c
# Opt level: O0

REF_STATUS
ref_geom_add_constrain_midnode
          (REF_GRID ref_grid,REF_INT node0,REF_INT node1,REF_DBL node1_weight,REF_INT new_node)

{
  REF_INT RVar1;
  REF_GEOM ref_geom_00;
  REF_NODE ref_node_00;
  REF_CELL pRVar2;
  uint uVar3;
  REF_STATUS ref_private_macro_code_rss_17;
  REF_STATUS ref_private_macro_code_rss_16;
  REF_STATUS ref_private_macro_code_rss_15;
  REF_STATUS ref_private_macro_code_rss_14;
  REF_STATUS ref_private_macro_code_rss_13;
  REF_STATUS ref_private_macro_code_rss_12;
  REF_STATUS ref_private_macro_code_rss_11;
  REF_STATUS ref_private_macro_code_rss_10;
  REF_STATUS ref_private_macro_code_rss_9;
  REF_LONG ref_private_status_reib_bi;
  REF_LONG ref_private_status_reib_ai;
  REF_STATUS ref_private_macro_code_rss_8;
  REF_STATUS ref_private_macro_code_rss_7;
  REF_STATUS ref_private_macro_code_rss_6;
  REF_STATUS ref_private_macro_code_rss_5;
  REF_STATUS ref_private_macro_code_rss_4;
  REF_STATUS ref_private_macro_code_rss_3;
  REF_STATUS ref_private_macro_code_rss_2;
  REF_STATUS ref_private_macro_code_rss_1;
  REF_STATUS ref_private_macro_code_rss;
  REF_DBL node0_weight;
  REF_BOOL support1;
  REF_BOOL support0;
  REF_INT geom1;
  REF_INT geom0;
  REF_INT face_geom;
  REF_INT cells [2];
  REF_INT ncell;
  REF_INT i;
  REF_STATUS status;
  REF_INT nodes [27];
  REF_INT local_94;
  REF_INT cell;
  REF_INT sense;
  REF_BOOL supported;
  REF_BOOL has_edge_support;
  REF_DBL param1 [2];
  REF_DBL param0 [2];
  REF_DBL param [2];
  REF_INT id;
  REF_INT type;
  REF_CELL ref_cell;
  REF_NODE ref_node;
  REF_GEOM ref_geom;
  REF_INT new_node_local;
  REF_DBL node1_weight_local;
  REF_INT node1_local;
  REF_INT node0_local;
  REF_GRID ref_grid_local;
  
  ref_geom_00 = ref_grid->geom;
  ref_node_00 = ref_grid->node;
  ref_grid_local._4_4_ = ref_geom_supported(ref_geom_00,node0,(REF_BOOL *)((long)&node0_weight + 4))
  ;
  if (ref_grid_local._4_4_ == 0) {
    ref_grid_local._4_4_ = ref_geom_supported(ref_geom_00,node1,(REF_BOOL *)&node0_weight);
    if (ref_grid_local._4_4_ == 0) {
      if ((node0_weight._4_4_ == 0) || (node0_weight._0_4_ == 0)) {
        ref_grid_local._4_4_ = 0;
      }
      else {
        pRVar2 = ref_grid->cell[0];
        i = node0;
        status = node1;
        uVar3 = ref_cell_with(pRVar2,&i,nodes + 0x1a);
        if (uVar3 == 5) {
          sense = 0;
        }
        else {
          if (uVar3 != 0) {
            printf("%s: %d: %s: %d %s\n",
                   "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_geom.c",
                   0x55a,"ref_geom_add_constrain_midnode",(ulong)uVar3,"search for edg");
            return uVar3;
          }
          uVar3 = ref_cell_nodes(pRVar2,nodes[0x1a],&i);
          if (uVar3 != 0) {
            printf("%s: %d: %s: %d %s\n",
                   "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_geom.c",
                   0x55b,"ref_geom_add_constrain_midnode",(ulong)uVar3,"get id");
            return uVar3;
          }
          RVar1 = (&i)[pRVar2->node_per];
          uVar3 = ref_geom_cell_tuv(ref_geom_00,node0,&i,1,param1 + 1,&local_94);
          if (uVar3 != 0) {
            printf("%s: %d: %s: %d %s\n",
                   "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_geom.c",
                   0x55f,"ref_geom_add_constrain_midnode",(ulong)uVar3,"cell uv");
            return uVar3;
          }
          uVar3 = ref_geom_cell_tuv(ref_geom_00,node1,&i,1,(REF_DBL *)&supported,&local_94);
          if (uVar3 != 0) {
            printf("%s: %d: %s: %d %s\n",
                   "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_geom.c",
                   0x561,"ref_geom_add_constrain_midnode",(ulong)uVar3,"cell uv");
            return uVar3;
          }
          param0[1] = (1.0 - node1_weight) * param1[1] + node1_weight * _supported;
          uVar3 = ref_egads_eval_at(ref_geom_00,1,RVar1,param0 + 1,
                                    ref_node_00->real + new_node * 0xf,(REF_DBL *)0x0);
          if (uVar3 != 0) {
            printf("%s: %d: %s: %d %s\n",
                   "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_geom.c",
                   0x565,"ref_geom_add_constrain_midnode",(ulong)uVar3,"eval");
            return uVar3;
          }
          uVar3 = ref_geom_add(ref_geom_00,new_node,1,RVar1,param0 + 1);
          if (uVar3 != 0) {
            printf("%s: %d: %s: %d %s\n",
                   "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_geom.c",
                   0x566,"ref_geom_add_constrain_midnode",(ulong)uVar3,"new geom");
            return uVar3;
          }
          sense = 1;
        }
        pRVar2 = ref_grid->cell[3];
        ref_grid_local._4_4_ = ref_cell_list_with2(pRVar2,node0,node1,2,cells,&geom0);
        if (ref_grid_local._4_4_ == 0) {
          if (cells[0] == 0) {
            ref_grid_local._4_4_ = 0;
          }
          else if ((ref_geom_00->manifold == 0) || ((long)cells[0] == 2)) {
            for (cells[1] = 0; cells[1] < cells[0]; cells[1] = cells[1] + 1) {
              nodes[0x1a] = (&geom0)[cells[1]];
              uVar3 = ref_cell_nodes(pRVar2,nodes[0x1a],&i);
              if (uVar3 != 0) {
                printf("%s: %d: %s: %d %s\n",
                       "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_geom.c"
                       ,0x57a,"ref_geom_add_constrain_midnode",(ulong)uVar3,"get id");
                return uVar3;
              }
              uVar3 = ref_geom_tri_supported(ref_geom_00,&i,&cell);
              if (uVar3 != 0) {
                printf("%s: %d: %s: %d %s\n",
                       "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_geom.c"
                       ,0x57c,"ref_geom_add_constrain_midnode",(ulong)uVar3,"tri support");
                return uVar3;
              }
              if (cell != 0) {
                RVar1 = (&i)[pRVar2->node_per];
                uVar3 = ref_geom_cell_tuv(ref_geom_00,node0,&i,2,param1 + 1,&local_94);
                if (uVar3 != 0) {
                  printf("%s: %d: %s: %d %s\n",
                         "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_geom.c"
                         ,0x582,"ref_geom_add_constrain_midnode",(ulong)uVar3,"cell uv");
                  return uVar3;
                }
                uVar3 = ref_geom_cell_tuv(ref_geom_00,node1,&i,2,(REF_DBL *)&supported,&local_94);
                if (uVar3 != 0) {
                  printf("%s: %d: %s: %d %s\n",
                         "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_geom.c"
                         ,0x584,"ref_geom_add_constrain_midnode",(ulong)uVar3,"cell uv");
                  return uVar3;
                }
                param0[1] = (1.0 - node1_weight) * param1[1] + node1_weight * _supported;
                uVar3 = ref_geom_add(ref_geom_00,new_node,2,RVar1,param0 + 1);
                if (uVar3 != 0) {
                  printf("%s: %d: %s: %d %s\n",
                         "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_geom.c"
                         ,0x588,"ref_geom_add_constrain_midnode",(ulong)uVar3,"new geom");
                  return uVar3;
                }
                uVar3 = ref_geom_find(ref_geom_00,new_node,2,RVar1,&geom1);
                if (uVar3 != 0) {
                  printf("%s: %d: %s: %d %s\n",
                         "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_geom.c"
                         ,0x58a,"ref_geom_add_constrain_midnode",(ulong)uVar3,"new face geom");
                  return uVar3;
                }
                uVar3 = ref_geom_find(ref_geom_00,node0,2,RVar1,&support0);
                if (uVar3 != 0) {
                  printf("%s: %d: %s: %d %s\n",
                         "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_geom.c"
                         ,0x58c,"ref_geom_add_constrain_midnode",(ulong)uVar3,"face geom");
                  return uVar3;
                }
                uVar3 = ref_geom_find(ref_geom_00,node1,2,RVar1,&support1);
                if (uVar3 != 0) {
                  printf("%s: %d: %s: %d %s\n",
                         "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_geom.c"
                         ,0x58d,"ref_geom_add_constrain_midnode",(ulong)uVar3,"face geom");
                  return uVar3;
                }
                if (((ref_geom_00->descr[support0 * 6 + 3] != 0) &&
                    (ref_geom_00->descr[support1 * 6 + 3] != 0)) &&
                   (ref_geom_00->descr[support0 * 6 + 3] == ref_geom_00->descr[support1 * 6 + 3])) {
                  ref_geom_00->descr[geom1 * 6 + 3] = ref_geom_00->descr[support0 * 6 + 3];
                }
                if ((sense == 0) &&
                   (uVar3 = ref_egads_eval_at(ref_geom_00,2,RVar1,param0 + 1,
                                              ref_node_00->real + new_node * 0xf,(REF_DBL *)0x0),
                   uVar3 != 0)) {
                  printf("%s: %d: %s: %d %s\n",
                         "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_geom.c"
                         ,0x596,"ref_geom_add_constrain_midnode",(ulong)uVar3,"eval");
                  return uVar3;
                }
              }
            }
            ref_grid_local._4_4_ = 0;
          }
          else {
            printf("%s: %d: %s: %s\nexpected %ld was %ld\n",
                   "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_geom.c",
                   0x576,"ref_geom_add_constrain_midnode","expected two tri for between",2,
                   (long)cells[0]);
            ref_geom_tattle(ref_geom_00,node0);
            ref_geom_tattle(ref_geom_00,node1);
            ref_node_location(ref_node_00,node0);
            ref_node_location(ref_node_00,node1);
            ref_grid_local._4_4_ = 1;
          }
        }
        else {
          printf("%s: %d: %s: %d %s\n",
                 "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_geom.c",
                 0x56c,"ref_geom_add_constrain_midnode",(ulong)ref_grid_local._4_4_,"list");
        }
      }
    }
    else {
      printf("%s: %d: %s: %d %s\n",
             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_geom.c",0x54d,
             "ref_geom_add_constrain_midnode",(ulong)ref_grid_local._4_4_,"node1 supported");
    }
  }
  else {
    printf("%s: %d: %s: %d %s\n",
           "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_geom.c",0x54c,
           "ref_geom_add_constrain_midnode",(ulong)ref_grid_local._4_4_,"node0 supported");
  }
  return ref_grid_local._4_4_;
}

Assistant:

REF_FCN REF_STATUS ref_geom_add_constrain_midnode(REF_GRID ref_grid,
                                                  REF_INT node0, REF_INT node1,
                                                  REF_DBL node1_weight,
                                                  REF_INT new_node) {
  REF_GEOM ref_geom = ref_grid_geom(ref_grid);
  REF_NODE ref_node = ref_grid_node(ref_grid);
  REF_CELL ref_cell;
  REF_INT type, id;
  REF_DBL param[2], param0[2], param1[2];
  REF_BOOL has_edge_support, supported;
  REF_INT sense, cell, nodes[REF_CELL_MAX_SIZE_PER];
  REF_STATUS status;
  REF_INT i, ncell, cells[2];
  REF_INT face_geom, geom0, geom1;
  REF_BOOL support0, support1;
  REF_DBL node0_weight = 1.0 - node1_weight;

  RSS(ref_geom_supported(ref_geom, node0, &support0), "node0 supported");
  RSS(ref_geom_supported(ref_geom, node1, &support1), "node1 supported");
  if (!support0 || !support1) {
    return REF_SUCCESS;
  }

  /* insert edge geom on edge cell if present */
  nodes[0] = node0;
  nodes[1] = node1;
  ref_cell = ref_grid_edg(ref_grid);
  status = ref_cell_with(ref_cell, nodes, &cell);
  if (REF_NOT_FOUND == status) {
    has_edge_support = REF_FALSE;
  } else {
    RSS(status, "search for edg");
    RSS(ref_cell_nodes(ref_cell, cell, nodes), "get id");
    id = nodes[ref_cell_node_per(ref_cell)];
    type = REF_GEOM_EDGE;
    RSS(ref_geom_cell_tuv(ref_geom, node0, nodes, type, param0, &sense),
        "cell uv");
    RSS(ref_geom_cell_tuv(ref_geom, node1, nodes, type, param1, &sense),
        "cell uv");
    param[0] = node0_weight * param0[0] + node1_weight * param1[0];
    RSS(ref_egads_eval_at(ref_geom, type, id, param,
                          ref_node_xyz_ptr(ref_node, new_node), NULL),
        "eval");
    RSS(ref_geom_add(ref_geom, new_node, type, id, param), "new geom");
    has_edge_support = REF_TRUE;
  }

  /* insert face between */
  ref_cell = ref_grid_tri(ref_grid);
  RSS(ref_cell_list_with2(ref_cell, node0, node1, 2, &ncell, cells), "list");
  if (0 == ncell) { /* volume edge */
    return REF_SUCCESS;
  }
  if (ref_geom_manifold(ref_geom)) {
    REIB(2, ncell, "expected two tri for between", {
      ref_geom_tattle(ref_geom, node0);
      ref_geom_tattle(ref_geom, node1);
      ref_node_location(ref_node, node0);
      ref_node_location(ref_node, node1);
    });
  }
  for (i = 0; i < ncell; i++) {
    cell = cells[i];
    RSS(ref_cell_nodes(ref_cell, cell, nodes), "get id");

    RSS(ref_geom_tri_supported(ref_geom, nodes, &supported), "tri support");
    if (!supported) continue; /* no geom support, skip */

    id = nodes[ref_cell_node_per(ref_cell)];
    type = REF_GEOM_FACE;
    RSS(ref_geom_cell_tuv(ref_geom, node0, nodes, type, param0, &sense),
        "cell uv");
    RSS(ref_geom_cell_tuv(ref_geom, node1, nodes, type, param1, &sense),
        "cell uv");
    param[0] = node0_weight * param0[0] + node1_weight * param1[0];
    param[1] = node0_weight * param0[1] + node1_weight * param1[1];

    RSS(ref_geom_add(ref_geom, new_node, type, id, param), "new geom");
    RSS(ref_geom_find(ref_geom, new_node, type, id, &face_geom),
        "new face geom");

    RSS(ref_geom_find(ref_geom, node0, type, id, &geom0), "face geom");
    RSS(ref_geom_find(ref_geom, node1, type, id, &geom1), "face geom");
    if (0 != ref_geom_jump(ref_geom, geom0) &&
        0 != ref_geom_jump(ref_geom, geom1) &&
        ref_geom_jump(ref_geom, geom0) == ref_geom_jump(ref_geom, geom1)) {
      ref_geom_jump(ref_geom, face_geom) = ref_geom_jump(ref_geom, geom0);
    }
    if (!has_edge_support) {
      RSS(ref_egads_eval_at(ref_geom, type, id, param,
                            ref_node_xyz_ptr(ref_node, new_node), NULL),
          "eval");
    }
  }

  return REF_SUCCESS;
}